

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DestroyContext(ImGuiContext *ctx)

{
  ImGuiContext *in_RDI;
  ImGuiContext *prev_ctx;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = GetCurrentContext();
  local_8 = in_RDI;
  if (in_RDI == (ImGuiContext *)0x0) {
    local_8 = local_18;
  }
  SetCurrentContext(local_8);
  Shutdown();
  if (local_18 == local_8) {
    local_18 = (ImGuiContext *)0x0;
  }
  SetCurrentContext(local_18);
  IM_DELETE<ImGuiContext>((ImGuiContext *)0x4b6eb6);
  return;
}

Assistant:

void ImGui::DestroyContext(ImGuiContext* ctx)
{
    ImGuiContext* prev_ctx = GetCurrentContext();
    if (ctx == NULL) //-V1051
        ctx = prev_ctx;
    SetCurrentContext(ctx);
    Shutdown();
    SetCurrentContext((prev_ctx != ctx) ? prev_ctx : NULL);
    IM_DELETE(ctx);
}